

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint32 flags)

{
  mz_zip_internal_state *pmVar1;
  uint uVar2;
  bool bVar3;
  mz_bool mVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  mz_uint8 *local_10f0;
  ulong local_10e8;
  mz_uint8 *local_10e0;
  mz_uint disk_index;
  mz_uint decomp_size;
  mz_uint comp_size;
  mz_uint total_header_size;
  mz_uint n_1;
  mz_uint i_1;
  int n;
  int i;
  mz_bool sort_central_dir;
  mz_uint8 *pBuf;
  mz_uint32 buf_u32 [1024];
  int *local_a0;
  mz_uint8 *p;
  mz_int64 cur_file_ofs;
  mz_uint64 cdir_ofs;
  mz_uint cdir_disk_index;
  mz_uint num_this_disk;
  mz_uint cdir_size;
  mz_uint32 flags_local;
  mz_zip_archive *pZip_local;
  
  bVar9 = (flags & 0x800) == 0;
  if (pZip->m_archive_size < 0x16) {
    return 0;
  }
  if ((long)(pZip->m_archive_size - 0x1000) < 1) {
    local_10e0 = (mz_uint8 *)0x0;
  }
  else {
    local_10e0 = (mz_uint8 *)(pZip->m_archive_size - 0x1000);
  }
  p = local_10e0;
  while( true ) {
    if (pZip->m_archive_size - (long)p < 0x1001) {
      local_10e8 = pZip->m_archive_size - (long)p;
    }
    else {
      local_10e8 = 0x1000;
    }
    sVar6 = (*pZip->m_pRead)(pZip->m_pIO_opaque,(mz_uint64)p,&pBuf,(long)(int)local_10e8);
    if (sVar6 != (local_10e8 & 0xffffffff)) {
      return 0;
    }
    i_1 = (int)local_10e8 - 4;
    while ((-1 < (int)i_1 &&
           (CONCAT13(*(undefined1 *)((long)buf_u32 + (long)(int)i_1 + -5),
                     CONCAT12(*(undefined1 *)((long)buf_u32 + (long)(int)i_1 + -6),
                              CONCAT11(*(undefined1 *)((long)buf_u32 + (long)(int)i_1 + -7),
                                       *(undefined1 *)((long)&pBuf + (long)(int)i_1)))) != 0x6054b50
           ))) {
      i_1 = i_1 - 1;
    }
    if (-1 < (int)i_1) break;
    if (p == (mz_uint8 *)0x0) {
      return 0;
    }
    if (0x10014 < pZip->m_archive_size - (long)p) {
      return 0;
    }
    if (p == (mz_uint8 *)0xffd) {
      local_10f0 = (mz_uint8 *)0x0;
    }
    else {
      local_10f0 = p + -0xffd;
    }
    p = local_10f0;
  }
  sVar6 = (*pZip->m_pRead)(pZip->m_pIO_opaque,(mz_uint64)(p + (int)i_1),&pBuf,0x16);
  if (sVar6 != 0x16) {
    return 0;
  }
  if (((int)pBuf != 0x6054b50) ||
     (pZip->m_total_files = (uint)buf_u32[0]._2_2_,
     (uint)buf_u32[0]._2_2_ != (uint)(ushort)buf_u32[0])) {
    return 0;
  }
  if ((pBuf._4_2_ != 0 || pBuf._6_2_ != 0) && ((pBuf._4_2_ != 1 || (pBuf._6_2_ != 1)))) {
    return 0;
  }
  comp_size = buf_u32[1];
  if (buf_u32[1] < pZip->m_total_files * 0x2e) {
    return 0;
  }
  uVar7 = (ulong)buf_u32[2];
  if (pZip->m_archive_size < uVar7 + buf_u32[1]) {
    return 0;
  }
  pZip->m_central_directory_file_ofs = uVar7;
  if (pZip->m_total_files != 0) {
    pmVar1 = pZip->m_pState;
    uVar8 = (ulong)buf_u32[1];
    if (((pmVar1->m_central_dir).m_capacity < uVar8) &&
       (mVar4 = mz_zip_array_ensure_capacity(pZip,&pmVar1->m_central_dir,uVar8,0), mVar4 == 0)) {
      bVar3 = false;
    }
    else {
      (pmVar1->m_central_dir).m_size = uVar8;
      bVar3 = true;
    }
    if (bVar3) {
      pmVar1 = pZip->m_pState;
      uVar8 = (ulong)pZip->m_total_files;
      if (((pmVar1->m_central_dir_offsets).m_capacity < uVar8) &&
         (mVar4 = mz_zip_array_ensure_capacity(pZip,&pmVar1->m_central_dir_offsets,uVar8,0),
         mVar4 == 0)) {
        bVar3 = false;
      }
      else {
        (pmVar1->m_central_dir_offsets).m_size = uVar8;
        bVar3 = true;
      }
      if (bVar3) {
        if (bVar9) {
          pmVar1 = pZip->m_pState;
          uVar8 = (ulong)pZip->m_total_files;
          if (((pmVar1->m_sorted_central_dir_offsets).m_capacity < uVar8) &&
             (mVar4 = mz_zip_array_ensure_capacity
                                (pZip,&pmVar1->m_sorted_central_dir_offsets,uVar8,0), mVar4 == 0)) {
            bVar3 = false;
          }
          else {
            (pmVar1->m_sorted_central_dir_offsets).m_size = uVar8;
            bVar3 = true;
          }
          if (!bVar3) {
            return 0;
          }
        }
        sVar6 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar7,(pZip->m_pState->m_central_dir).m_p,
                                 (size_t)buf_u32[1]);
        if (sVar6 != buf_u32[1]) {
          return 0;
        }
        local_a0 = (int *)(pZip->m_pState->m_central_dir).m_p;
        for (total_header_size = 0; total_header_size < pZip->m_total_files;
            total_header_size = total_header_size + 1) {
          if ((comp_size < 0x2e) || (*local_a0 != 0x2014b50)) {
            return 0;
          }
          *(int *)((long)(pZip->m_pState->m_central_dir_offsets).m_p + (ulong)total_header_size * 4)
               = (int)local_a0 - (int)(pZip->m_pState->m_central_dir).m_p;
          if (bVar9) {
            *(mz_uint *)
             ((long)(pZip->m_pState->m_sorted_central_dir_offsets).m_p +
             (ulong)total_header_size * 4) = total_header_size;
          }
          uVar5 = local_a0[5];
          uVar2 = local_a0[6];
          if ((((*(int *)((long)local_a0 + 10) == 0) && (uVar2 != uVar5)) ||
              ((uVar2 != 0 && (uVar5 == 0)))) || ((uVar2 == 0xffffffff || (uVar5 == 0xffffffff)))) {
            return 0;
          }
          if ((*(short *)((long)local_a0 + 0x22) != pBuf._4_2_) &&
             (*(short *)((long)local_a0 + 0x22) != 1)) {
            return 0;
          }
          if (pZip->m_archive_size < (ulong)*(uint *)((long)local_a0 + 0x2a) + 0x1e + (ulong)uVar5)
          {
            return 0;
          }
          uVar5 = *(ushort *)(local_a0 + 7) + 0x2e + (uint)*(ushort *)((long)local_a0 + 0x1e) +
                  (uint)*(ushort *)(local_a0 + 8);
          if (comp_size < uVar5) {
            return 0;
          }
          comp_size = comp_size - uVar5;
          local_a0 = (int *)((long)local_a0 + (ulong)uVar5);
        }
        goto LAB_00563d2e;
      }
    }
    return 0;
  }
LAB_00563d2e:
  if (bVar9) {
    mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);
  }
  return 1;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,
                                              mz_uint32 flags) {
  mz_uint cdir_size, num_this_disk, cdir_disk_index;
  mz_uint64 cdir_ofs;
  mz_int64 cur_file_ofs;
  const mz_uint8 *p;
  mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
  mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
  mz_bool sort_central_dir =
      ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
  // Basic sanity checks - reject files which are too small, and check the first
  // 4 bytes of the file to make sure a local header is there.
  if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  // Find the end of central directory record by scanning the file from the end
  // towards the beginning.
  cur_file_ofs =
      MZ_MAX((mz_int64)pZip->m_archive_size - (mz_int64)sizeof(buf_u32), 0);
  for (;;) {
    int i,
        n = (int)MZ_MIN(sizeof(buf_u32), pZip->m_archive_size - cur_file_ofs);
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, n) != (mz_uint)n)
      return MZ_FALSE;
    for (i = n - 4; i >= 0; --i)
      if (MZ_READ_LE32(pBuf + i) == MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
        break;
    if (i >= 0) {
      cur_file_ofs += i;
      break;
    }
    if ((!cur_file_ofs) || ((pZip->m_archive_size - cur_file_ofs) >=
                            (0xFFFF + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)))
      return MZ_FALSE;
    cur_file_ofs = MZ_MAX(cur_file_ofs - (sizeof(buf_u32) - 3), 0);
  }
  // Read and verify the end of central directory record.
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                    MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if ((MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) !=
       MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG) ||
      ((pZip->m_total_files =
            MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS)) !=
       MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS)))
    return MZ_FALSE;

  num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
  cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
  if (((num_this_disk | cdir_disk_index) != 0) &&
      ((num_this_disk != 1) || (cdir_disk_index != 1)))
    return MZ_FALSE;

  if ((cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS)) <
      pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;

  cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);
  if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
    return MZ_FALSE;

  pZip->m_central_directory_file_ofs = cdir_ofs;

  if (pZip->m_total_files) {
    mz_uint i, n;

    // Read the entire central directory into a heap block, and allocate another
    // heap block to hold the unsorted central dir file record offsets, and
    // another to hold the sorted indices.
    if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size,
                              MZ_FALSE)) ||
        (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets,
                              pZip->m_total_files, MZ_FALSE)))
      return MZ_FALSE;

    if (sort_central_dir) {
      if (!mz_zip_array_resize(pZip,
                               &pZip->m_pState->m_sorted_central_dir_offsets,
                               pZip->m_total_files, MZ_FALSE))
        return MZ_FALSE;
    }

    if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs,
                      pZip->m_pState->m_central_dir.m_p,
                      cdir_size) != cdir_size)
      return MZ_FALSE;

    // Now create an index into the central directory file records, do some
    // basic sanity checking on each record, and check for zip64 entries (which
    // are not yet supported).
    p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
    for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i) {
      mz_uint total_header_size, comp_size, decomp_size, disk_index;
      if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) ||
          (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
        return MZ_FALSE;
      MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32,
                           i) =
          (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);
      if (sort_central_dir)
        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets,
                             mz_uint32, i) = i;
      comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
      decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
      if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) &&
           (decomp_size != comp_size)) ||
          (decomp_size && !comp_size) || (decomp_size == 0xFFFFFFFF) ||
          (comp_size == 0xFFFFFFFF))
        return MZ_FALSE;
      disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
      if ((disk_index != num_this_disk) && (disk_index != 1))
        return MZ_FALSE;
      if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) +
           MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
        return MZ_FALSE;
      if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) >
          n)
        return MZ_FALSE;
      n -= total_header_size;
      p += total_header_size;
    }
  }

  if (sort_central_dir)
    mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

  return MZ_TRUE;
}